

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O0

void __thiscall PathMeld::append(PathMeld *this,PathMeld *op2)

{
  const_iterator __first;
  const_iterator __last;
  size_type sVar1;
  reference pvVar2;
  int local_6c;
  int4 i;
  __normal_iterator<PathMeld::RootedOp_*,_std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>_>
  local_50;
  const_iterator local_48;
  Varnode **local_40;
  Varnode **local_38;
  __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_> local_30;
  __normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_> local_28;
  const_iterator local_20;
  PathMeld *local_18;
  PathMeld *op2_local;
  PathMeld *this_local;
  
  local_18 = op2;
  op2_local = this;
  local_28._M_current =
       (Varnode **)std::vector<Varnode_*,_std::allocator<Varnode_*>_>::begin(&this->commonVn);
  __gnu_cxx::__normal_iterator<Varnode*const*,std::vector<Varnode*,std::allocator<Varnode*>>>::
  __normal_iterator<Varnode**>
            ((__normal_iterator<Varnode*const*,std::vector<Varnode*,std::allocator<Varnode*>>> *)
             &local_20,&local_28);
  local_30._M_current =
       (Varnode **)std::vector<Varnode_*,_std::allocator<Varnode_*>_>::begin(&local_18->commonVn);
  local_38 = (Varnode **)
             std::vector<Varnode_*,_std::allocator<Varnode_*>_>::end(&local_18->commonVn);
  local_40 = (Varnode **)
             std::vector<Varnode*,std::allocator<Varnode*>>::
             insert<__gnu_cxx::__normal_iterator<Varnode*const*,std::vector<Varnode*,std::allocator<Varnode*>>>,void>
                       ((vector<Varnode*,std::allocator<Varnode*>> *)this,local_20,local_30,
                        (__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                         )local_38);
  local_50._M_current =
       (RootedOp *)
       std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>::begin(&this->opMeld);
  __gnu_cxx::
  __normal_iterator<PathMeld::RootedOp_const*,std::vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>>>
  ::__normal_iterator<PathMeld::RootedOp*>
            ((__normal_iterator<PathMeld::RootedOp_const*,std::vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>>>
              *)&local_48,&local_50);
  __first = std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>::begin
                      (&local_18->opMeld);
  __last = std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>::end
                     (&local_18->opMeld);
  std::vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>>::
  insert<__gnu_cxx::__normal_iterator<PathMeld::RootedOp_const*,std::vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>>>,void>
            ((vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>> *)&this->opMeld,local_48
             ,(__normal_iterator<const_PathMeld::RootedOp_*,_std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>_>
               )__first._M_current,
             (__normal_iterator<const_PathMeld::RootedOp_*,_std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>_>
              )__last._M_current);
  sVar1 = std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>::size
                    (&local_18->opMeld);
  local_6c = (int)sVar1;
  while( true ) {
    sVar1 = std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>::size
                      (&this->opMeld);
    if (sVar1 <= (ulong)(long)local_6c) break;
    sVar1 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&local_18->commonVn);
    pvVar2 = std::vector<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>::operator[]
                       (&this->opMeld,(long)local_6c);
    pvVar2->rootVn = pvVar2->rootVn + (int)sVar1;
    local_6c = local_6c + 1;
  }
  return;
}

Assistant:

void PathMeld::append(const PathMeld &op2)

{
  commonVn.insert(commonVn.begin(),op2.commonVn.begin(),op2.commonVn.end());
  opMeld.insert(opMeld.begin(),op2.opMeld.begin(),op2.opMeld.end());
  // Renumber all the rootVn refs to varnodes we have moved
  for(int4 i=op2.opMeld.size();i<opMeld.size();++i)
    opMeld[i].rootVn += op2.commonVn.size();
}